

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_membuf.c
# Opt level: O0

void membuff_init(membuff_t *mb,size_t initial_size)

{
  char *pcVar1;
  size_t initial_size_local;
  membuff_t *mb_local;
  
  if (initial_size == 0) {
    mb->buf = (char *)0x0;
  }
  else {
    pcVar1 = (char *)calloc(1,initial_size);
    mb->buf = pcVar1;
    if (mb->buf == (char *)0x0) {
      fprintf(_stderr,"out of memory\n");
      exit(1);
    }
  }
  mb->pos = 0;
  mb->allocated_size = initial_size;
  return;
}

Assistant:

void membuff_init(membuff_t *mb, size_t initial_size) {
  if (initial_size > 0) {
    mb->buf = (char *)calloc(1, initial_size);
    if (mb->buf == NULL) {
      fprintf(stderr, "out of memory\n");
      exit(1);
    }
  }
  else
    mb->buf = NULL;
  mb->pos = 0;
  mb->allocated_size = initial_size;
}